

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O2

int writeLong(FILE *stream,writeoutvar *wovar,per_transfer *per,CURLcode per_result,_Bool use_json)

{
  writeoutid wVar1;
  ulong uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  long longinfo;
  
  longinfo = 0;
  if (wovar->ci == CURLINFO_NONE) {
    wVar1 = wovar->id;
    if (wVar1 == VAR_EXITCODE) {
      uVar2 = (ulong)per_result;
    }
    else if (wVar1 == VAR_NUM_CERTS) {
      certinfo(per);
      if (per->certinfo == (curl_certinfo *)0x0) {
        uVar2 = 0;
      }
      else {
        uVar2 = (long)per->certinfo->num_of_certs;
      }
    }
    else if (wVar1 == VAR_NUM_HEADERS) {
      uVar2 = per->num_headers;
    }
    else if (wVar1 == VAR_URLNUM) {
      uVar2 = (long)(int)per->urlnum;
      if ((long)(int)per->urlnum < 0) goto LAB_0011d71c;
    }
    else {
      if (wVar1 != VAR_NUM_RETRY) {
LAB_0011d71c:
        if (!use_json) {
          return 1;
        }
        pcVar5 = "\"%s\":null";
        pcVar4 = wovar->name;
        goto LAB_0011d7ca;
      }
      uVar2 = per->num_retries;
    }
  }
  else {
    iVar3 = curl_easy_getinfo(per->curl,wovar->ci,&longinfo);
    uVar2 = longinfo;
    if (iVar3 != 0) goto LAB_0011d71c;
  }
  longinfo = uVar2;
  if (use_json) {
    curl_mfprintf(stream,"\"%s\":%ld",wovar->name,longinfo);
    return 1;
  }
  pcVar4 = (char *)longinfo;
  if (wovar->id - VAR_HTTP_CODE < 2) {
    pcVar5 = "%03ld";
  }
  else {
    pcVar5 = "%ld";
  }
LAB_0011d7ca:
  curl_mfprintf(stream,pcVar5,pcVar4);
  return 1;
}

Assistant:

static int writeLong(FILE *stream, const struct writeoutvar *wovar,
                     struct per_transfer *per, CURLcode per_result,
                     bool use_json)
{
  bool valid = false;
  long longinfo = 0;

  DEBUGASSERT(wovar->writefunc == writeLong);

  if(wovar->ci) {
    if(!curl_easy_getinfo(per->curl, wovar->ci, &longinfo))
      valid = true;
  }
  else {
    switch(wovar->id) {
    case VAR_NUM_RETRY:
      longinfo = per->num_retries;
      valid = true;
      break;
    case VAR_NUM_CERTS:
      certinfo(per);
      longinfo = per->certinfo ? per->certinfo->num_of_certs : 0;
      valid = true;
      break;
    case VAR_NUM_HEADERS:
      longinfo = per->num_headers;
      valid = true;
      break;
    case VAR_EXITCODE:
      longinfo = (long)per_result;
      valid = true;
      break;
    case VAR_URLNUM:
      if(per->urlnum <= INT_MAX) {
        longinfo = (long)per->urlnum;
        valid = true;
      }
      break;
    default:
      DEBUGASSERT(0);
      break;
    }
  }

  if(valid) {
    if(use_json)
      fprintf(stream, "\"%s\":%ld", wovar->name, longinfo);
    else {
      if(wovar->id == VAR_HTTP_CODE || wovar->id == VAR_HTTP_CODE_PROXY)
        fprintf(stream, "%03ld", longinfo);
      else
        fprintf(stream, "%ld", longinfo);
    }
  }
  else {
    if(use_json)
      fprintf(stream, "\"%s\":null", wovar->name);
  }

  return 1; /* return 1 if anything was written */
}